

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

void __thiscall ELFIO::elfio::create_mandatory_sections(elfio *this)

{
  section *psVar1;
  section *shstrtab;
  section *sec0;
  undefined8 in_stack_ffffffffffffff58;
  elfio *in_stack_ffffffffffffff60;
  allocator local_71;
  string local_70 [8];
  elfio *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffb8;
  Sections *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [32];
  section *local_10;
  
  local_10 = create_section(in_stack_ffffffffffffff98);
  (*local_10->_vptr_section[0x1e])(local_10,0);
  psVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"",&local_31);
  (*psVar1->_vptr_section[4])(psVar1,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (*local_10->_vptr_section[0x16])(local_10,0);
  set_section_name_str_index
            (in_stack_ffffffffffffff60,(Elf_Half)((ulong)in_stack_ffffffffffffff58 >> 0x30));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,".shstrtab",&local_71);
  psVar1 = Sections::add(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  (*psVar1->_vptr_section[6])(psVar1,3);
  (*psVar1->_vptr_section[0xe])(psVar1,1);
  return;
}

Assistant:

void create_mandatory_sections()
    {
        // Create null section without calling to 'add_section' as no string
        // section containing section names exists yet
        section* sec0 = create_section();
        sec0->set_index( 0 );
        sec0->set_name( "" );
        sec0->set_name_string_offset( 0 );

        set_section_name_str_index( 1 );
        section* shstrtab = sections.add( ".shstrtab" );
        shstrtab->set_type( SHT_STRTAB );
        shstrtab->set_addr_align( 1 );
    }